

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 jx9CompileScript(jx9_vm *pVm,SyString *pScript,sxi32 iFlags)

{
  sxu32 in_EAX;
  SySet aToken;
  SySet local_40;
  
  if (pScript->nByte != 0) {
    local_40.nUsed = 0;
    local_40.nSize = 0;
    local_40.eSize = 0x20;
    local_40.nCursor = 0;
    local_40.pBase = (SyToken *)0x0;
    local_40.pUserData = (void *)0x0;
    local_40.pAllocator = &pVm->sAllocator;
    SySetAlloc(&local_40,0xc0);
    jx9Tokenize(pScript->zString,pScript->nByte,&local_40);
    in_EAX = local_40.nUsed;
    if ((local_40._16_8_ & 0xffffffff) != 0) {
      (pVm->sCodeGen).pIn = (SyToken *)local_40.pBase;
      (pVm->sCodeGen).pEnd =
           (SyToken *)((long)local_40.pBase + (local_40._16_8_ & 0xffffffff) * 0x20);
      GenStateCompileChunk(&pVm->sCodeGen,0);
      in_EAX = SySetRelease(&local_40);
    }
  }
  return in_EAX;
}

Assistant:

JX9_PRIVATE sxi32 jx9CompileScript(
	jx9_vm *pVm,        /* Generate JX9 bytecodes for this Virtual Machine */
	SyString *pScript,  /* Script to compile */
	sxi32 iFlags        /* Compile flags */
	)
{
	jx9_gen_state *pGen;
	SySet aToken;
	sxi32 rc;
	if( pScript->nByte < 1 ){
		/* Nothing to compile */
		return JX9_OK;
	}
	/* Initialize the tokens containers */
	SySetInit(&aToken, &pVm->sAllocator, sizeof(SyToken));
	SySetAlloc(&aToken, 0xc0);
	pGen = &pVm->sCodeGen;
	rc = JX9_OK;
	/* Tokenize the JX9 chunk first */
	jx9Tokenize(pScript->zString,pScript->nByte,&aToken);
	if( SySetUsed(&aToken) < 1 ){
		return SXERR_EMPTY;
	}
	/* Point to the head and tail of the token stream. */
	pGen->pIn  = (SyToken *)SySetBasePtr(&aToken);
	pGen->pEnd = &pGen->pIn[SySetUsed(&aToken)];
	/* Compile the chunk */
	rc = GenStateCompileChunk(pGen,iFlags);
	/* Cleanup */
	SySetRelease(&aToken);
	return rc;
}